

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O1

bool __thiscall
tinyusdz::Attribute::get_value<std::__cxx11::string>
          (Attribute *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *v)

{
  anon_struct_8_0_00000001_for___align aVar1;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> ret;
  anon_struct_8_0_00000001_for___align local_60;
  undefined8 local_58;
  long local_50;
  undefined8 uStack_48;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_40;
  
  if (v == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    local_40.has_value_ = false;
  }
  else {
    primvar::PrimVar::get_value<std::__cxx11::string>(&local_40,&this->_var);
    if (local_40.has_value_ == true) {
      aVar1 = (anon_struct_8_0_00000001_for___align)((long)&local_40.contained + 0x10);
      if (local_40.contained.data.__align == aVar1) {
        uStack_48 = local_40.contained._24_8_;
        local_60 = (anon_struct_8_0_00000001_for___align)&local_50;
      }
      else {
        local_60 = local_40.contained.data.__align;
      }
      local_50 = CONCAT71(local_40.contained._17_7_,local_40.contained._16_1_);
      local_58 = local_40.contained._8_8_;
      local_40.contained._8_8_ = 0;
      local_40.contained._16_1_ = 0;
      local_40.contained.data.__align = aVar1;
    }
    if ((local_40.has_value_ == true) &&
       (::std::__cxx11::string::operator=((string *)v,(string *)&local_60),
       local_60 != (anon_struct_8_0_00000001_for___align)&local_50)) {
      operator_delete((void *)local_60,local_50 + 1);
    }
  }
  return local_40.has_value_;
}

Assistant:

bool get_value(T *v) const {
    if (!v) {
      return false;
    }

    nonstd::optional<T> ret = _var.get_value<T>();
    if (ret) {
      (*v) = std::move(ret.value());
      return true;
    }

    return false;
  }